

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double coupon_mean(int j,int type_num)

{
  int iVar1;
  double dVar2;
  
  if (type_num < j) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"COUPON_MEAN - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Number of distinct coupons desired must be no more\n");
    std::operator<<((ostream *)&std::cerr,"  than the total number of boxes opened.\n");
    exit(1);
  }
  dVar2 = 0.0;
  iVar1 = type_num;
  if (0 < j) {
    do {
      dVar2 = dVar2 + 1.0 / (double)iVar1;
      j = j + -1;
      iVar1 = iVar1 + -1;
    } while (j != 0);
  }
  return (double)type_num * dVar2;
}

Assistant:

double coupon_mean ( int j, int type_num )

//****************************************************************************80
//
//  Purpose:
//
//    COUPON_MEAN returns the mean of the Coupon PDF.
//
//  Discussion:
//
//    In this version of the coupon collector's problem, we assume
//    that each box contains 1 coupon, that there are TYPE_NUM distinct types
//    of coupon, uniformly distributed among an inexhaustible supply
//    of boxes, and that the collector's goal is to get J distinct
//    types of coupons by opening one box after another.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int J, the number of distinct coupons to be collected.
//    J must be between 1 and N.
//
//    Input, int TYPE_NUM, the number of distinct coupons.
//
//    Output, double COUPON_MEAN, the mean number of boxes that
//    must be opened in order to just get J distinct kinds.
//
{
  int i;
  double mean;

  if ( type_num < j )
  {
    cerr << " \n";
    cerr << "COUPON_MEAN - Fatal error!\n";
    cerr << "  Number of distinct coupons desired must be no more\n";
    cerr << "  than the total number of boxes opened.\n";
    exit ( 1 );
  }

  mean = 0.0;

  for ( i = 1; i <= j; i++ )
  {
    mean = mean + 1.0 / static_cast<double>(type_num - i + 1 );
  }
  mean = mean * static_cast<double>(type_num );

  return mean;
}